

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::InstructionDisassembler
          (InstructionDisassembler *this,AssemblyGrammar *grammar,ostream *stream,uint32_t options,
          NameMapper *name_mapper)

{
  byte bVar1;
  
  this->grammar_ = grammar;
  this->stream_ = stream;
  bVar1 = (byte)options;
  this->print_ = (bool)(bVar1 >> 1 & 1);
  this->color_ = (bool)(bVar1 >> 2 & 1);
  this->indent_ = (int)(options << 0x1c) >> 0x1f & 0xf;
  this->nested_indent_ = (bool)((byte)(options >> 8) & 1);
  this->comment_ = options >> 7 & 1;
  this->show_byte_offset_ = (bool)(bVar1 >> 4 & 1);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
  ::function(&this->name_mapper_,name_mapper);
  (this->id_comments_)._M_h._M_buckets = &(this->id_comments_)._M_h._M_single_bucket;
  (this->id_comments_)._M_h._M_bucket_count = 1;
  (this->id_comments_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id_comments_)._M_h._M_element_count = 0;
  (this->id_comments_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id_comments_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id_comments_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->last_instruction_comment_alignment_ = 0;
  return;
}

Assistant:

InstructionDisassembler::InstructionDisassembler(const AssemblyGrammar& grammar,
                                                 std::ostream& stream,
                                                 uint32_t options,
                                                 NameMapper name_mapper)
    : grammar_(grammar),
      stream_(stream),
      print_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_PRINT, options)),
      color_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_COLOR, options)),
      indent_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_INDENT, options)
                  ? kStandardIndent
                  : 0),
      nested_indent_(
          spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NESTED_INDENT, options)),
      comment_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_COMMENT, options)),
      show_byte_offset_(
          spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_SHOW_BYTE_OFFSET, options)),
      name_mapper_(std::move(name_mapper)),
      last_instruction_comment_alignment_(0) {}